

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

target_ulong helper_lar_x86_64(CPUX86State *env,target_ulong selector1)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  uint32_t e2;
  uint32_t e1;
  uint local_20;
  uint32_t local_1c;
  
  uVar1 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  if ((selector1 & 0xfffc) != 0) {
    iVar2 = load_segment_ra(env,&local_1c,&local_20,(uint)selector1 & 0xffff,unaff_retaddr);
    if (iVar2 == 0) {
      uVar6 = (uint)selector1 & 3;
      uVar3 = local_20 >> 0xd & 3;
      uVar4 = env->hflags & 3;
      if ((local_20 >> 0xc & 1) == 0) {
        uVar5 = local_20 >> 8 & 0xf;
        if ((uVar5 < 0xd) && (((0x1a3eU >> uVar5 & 1) != 0 && (uVar4 <= uVar3 && uVar6 <= uVar3))))
        {
LAB_004da2ef:
          env->cc_src = (ulong)(uVar1 | 0x40);
          return (ulong)(local_20 & 0xf0ff00);
        }
      }
      else if (((~local_20 & 0xc00) == 0) || (uVar6 <= uVar3 && uVar4 <= uVar3)) goto LAB_004da2ef;
    }
  }
  env->cc_src = (ulong)(uVar1 & 0xffffffbf);
  return 0;
}

Assistant:

target_ulong helper_lar(CPUX86State *env, target_ulong selector1)
{
    uint32_t e1, e2, eflags, selector;
    int rpl, dpl, cpl, type;

    selector = selector1 & 0xffff;
    eflags = cpu_cc_compute_all(env, CC_OP);
    if ((selector & 0xfffc) == 0) {
        goto fail;
    }
    if (load_segment_ra(env, &e1, &e2, selector, GETPC()) != 0) {
        goto fail;
    }
    rpl = selector & 3;
    dpl = (e2 >> DESC_DPL_SHIFT) & 3;
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if ((e2 & DESC_CS_MASK) && (e2 & DESC_C_MASK)) {
            /* conforming */
        } else {
            if (dpl < cpl || dpl < rpl) {
                goto fail;
            }
        }
    } else {
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        switch (type) {
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 9:
        case 11:
        case 12:
            break;
        default:
            goto fail;
        }
        if (dpl < cpl || dpl < rpl) {
        fail:
            CC_SRC = eflags & ~CC_Z;
            return 0;
        }
    }
    CC_SRC = eflags | CC_Z;
    return e2 & 0x00f0ff00;
}